

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct64x64_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  undefined1 auVar7 [16];
  uint uVar12;
  undefined1 auVar13 [16];
  int iVar14;
  
  iVar4 = 1 << ((char)bit - 1U & 0x1f);
  iVar5 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar3 = 0x8000;
  if (0xf < iVar5) {
    iVar3 = 1 << ((char)iVar5 - 1U & 0x1f);
  }
  auVar13 = ZEXT416((uint)bit);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + (long)bit * 0x100 + 0x1e0);
  auVar7._4_4_ = uVar1;
  auVar7._0_4_ = uVar1;
  auVar7._8_4_ = uVar1;
  auVar7._12_4_ = uVar1;
  auVar7 = pmulld(auVar7,(undefined1  [16])*in);
  iVar5 = auVar7._0_4_ + iVar4 >> auVar13;
  iVar8 = auVar7._4_4_ + iVar4 >> auVar13;
  iVar10 = auVar7._8_4_ + iVar4 >> auVar13;
  iVar4 = auVar7._12_4_ + iVar4 >> auVar13;
  if (do_cols == 0) {
    iVar3 = 10;
    if (10 < bd) {
      iVar3 = bd;
    }
    iVar3 = 0x20 << ((byte)iVar3 & 0x1f);
    iVar2 = -iVar3;
    iVar3 = iVar3 + -1;
    if (out_shift != 0) {
      iVar14 = (1 << ((byte)out_shift & 0x1f)) >> 1;
      auVar7 = ZEXT416((uint)out_shift);
      iVar5 = iVar5 + iVar14 >> auVar7;
      iVar8 = iVar8 + iVar14 >> auVar7;
      iVar10 = iVar10 + iVar14 >> auVar7;
      iVar4 = iVar4 + iVar14 >> auVar7;
    }
  }
  else {
    iVar2 = -iVar3;
    iVar3 = iVar3 + -1;
  }
  uVar6 = (uint)(iVar5 < iVar2) * iVar2 | (uint)(iVar5 >= iVar2) * iVar5;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar2) * iVar2 | (uint)(iVar10 >= iVar2) * iVar10;
  uVar12 = (uint)(iVar4 < iVar2) * iVar2 | (uint)(iVar4 >= iVar2) * iVar4;
  uVar6 = (uint)(iVar3 < (int)uVar6) * iVar3 | (iVar3 >= (int)uVar6) * uVar6;
  uVar9 = (uint)(iVar3 < (int)uVar9) * iVar3 | (iVar3 >= (int)uVar9) * uVar9;
  uVar11 = (uint)(iVar3 < (int)uVar11) * iVar3 | (iVar3 >= (int)uVar11) * uVar11;
  uVar12 = (uint)(iVar3 < (int)uVar12) * iVar3 | (iVar3 >= (int)uVar12) * uVar12;
  *(uint *)*out = uVar6;
  *(uint *)((long)*out + 4) = uVar9;
  *(uint *)(*out + 1) = uVar11;
  *(uint *)((long)*out + 0xc) = uVar12;
  *(uint *)out[1] = uVar6;
  *(uint *)((long)out[1] + 4) = uVar9;
  *(uint *)(out[1] + 1) = uVar11;
  *(uint *)((long)out[1] + 0xc) = uVar12;
  *(uint *)out[2] = uVar6;
  *(uint *)((long)out[2] + 4) = uVar9;
  *(uint *)(out[2] + 1) = uVar11;
  *(uint *)((long)out[2] + 0xc) = uVar12;
  *(uint *)out[3] = uVar6;
  *(uint *)((long)out[3] + 4) = uVar9;
  *(uint *)(out[3] + 1) = uVar11;
  *(uint *)((long)out[3] + 0xc) = uVar12;
  *(uint *)out[4] = uVar6;
  *(uint *)((long)out[4] + 4) = uVar9;
  *(uint *)(out[4] + 1) = uVar11;
  *(uint *)((long)out[4] + 0xc) = uVar12;
  *(uint *)out[5] = uVar6;
  *(uint *)((long)out[5] + 4) = uVar9;
  *(uint *)(out[5] + 1) = uVar11;
  *(uint *)((long)out[5] + 0xc) = uVar12;
  *(uint *)out[6] = uVar6;
  *(uint *)((long)out[6] + 4) = uVar9;
  *(uint *)(out[6] + 1) = uVar11;
  *(uint *)((long)out[6] + 0xc) = uVar12;
  *(uint *)out[7] = uVar6;
  *(uint *)((long)out[7] + 4) = uVar9;
  *(uint *)(out[7] + 1) = uVar11;
  *(uint *)((long)out[7] + 0xc) = uVar12;
  *(uint *)out[8] = uVar6;
  *(uint *)((long)out[8] + 4) = uVar9;
  *(uint *)(out[8] + 1) = uVar11;
  *(uint *)((long)out[8] + 0xc) = uVar12;
  *(uint *)out[9] = uVar6;
  *(uint *)((long)out[9] + 4) = uVar9;
  *(uint *)(out[9] + 1) = uVar11;
  *(uint *)((long)out[9] + 0xc) = uVar12;
  *(uint *)out[10] = uVar6;
  *(uint *)((long)out[10] + 4) = uVar9;
  *(uint *)(out[10] + 1) = uVar11;
  *(uint *)((long)out[10] + 0xc) = uVar12;
  *(uint *)out[0xb] = uVar6;
  *(uint *)((long)out[0xb] + 4) = uVar9;
  *(uint *)(out[0xb] + 1) = uVar11;
  *(uint *)((long)out[0xb] + 0xc) = uVar12;
  *(uint *)out[0xc] = uVar6;
  *(uint *)((long)out[0xc] + 4) = uVar9;
  *(uint *)(out[0xc] + 1) = uVar11;
  *(uint *)((long)out[0xc] + 0xc) = uVar12;
  *(uint *)out[0xd] = uVar6;
  *(uint *)((long)out[0xd] + 4) = uVar9;
  *(uint *)(out[0xd] + 1) = uVar11;
  *(uint *)((long)out[0xd] + 0xc) = uVar12;
  *(uint *)out[0xe] = uVar6;
  *(uint *)((long)out[0xe] + 4) = uVar9;
  *(uint *)(out[0xe] + 1) = uVar11;
  *(uint *)((long)out[0xe] + 0xc) = uVar12;
  *(uint *)out[0xf] = uVar6;
  *(uint *)((long)out[0xf] + 4) = uVar9;
  *(uint *)(out[0xf] + 1) = uVar11;
  *(uint *)((long)out[0xf] + 0xc) = uVar12;
  *(uint *)out[0x10] = uVar6;
  *(uint *)((long)out[0x10] + 4) = uVar9;
  *(uint *)(out[0x10] + 1) = uVar11;
  *(uint *)((long)out[0x10] + 0xc) = uVar12;
  *(uint *)out[0x11] = uVar6;
  *(uint *)((long)out[0x11] + 4) = uVar9;
  *(uint *)(out[0x11] + 1) = uVar11;
  *(uint *)((long)out[0x11] + 0xc) = uVar12;
  *(uint *)out[0x12] = uVar6;
  *(uint *)((long)out[0x12] + 4) = uVar9;
  *(uint *)(out[0x12] + 1) = uVar11;
  *(uint *)((long)out[0x12] + 0xc) = uVar12;
  *(uint *)out[0x13] = uVar6;
  *(uint *)((long)out[0x13] + 4) = uVar9;
  *(uint *)(out[0x13] + 1) = uVar11;
  *(uint *)((long)out[0x13] + 0xc) = uVar12;
  *(uint *)out[0x14] = uVar6;
  *(uint *)((long)out[0x14] + 4) = uVar9;
  *(uint *)(out[0x14] + 1) = uVar11;
  *(uint *)((long)out[0x14] + 0xc) = uVar12;
  *(uint *)out[0x15] = uVar6;
  *(uint *)((long)out[0x15] + 4) = uVar9;
  *(uint *)(out[0x15] + 1) = uVar11;
  *(uint *)((long)out[0x15] + 0xc) = uVar12;
  *(uint *)out[0x16] = uVar6;
  *(uint *)((long)out[0x16] + 4) = uVar9;
  *(uint *)(out[0x16] + 1) = uVar11;
  *(uint *)((long)out[0x16] + 0xc) = uVar12;
  *(uint *)out[0x17] = uVar6;
  *(uint *)((long)out[0x17] + 4) = uVar9;
  *(uint *)(out[0x17] + 1) = uVar11;
  *(uint *)((long)out[0x17] + 0xc) = uVar12;
  *(uint *)out[0x18] = uVar6;
  *(uint *)((long)out[0x18] + 4) = uVar9;
  *(uint *)(out[0x18] + 1) = uVar11;
  *(uint *)((long)out[0x18] + 0xc) = uVar12;
  *(uint *)out[0x19] = uVar6;
  *(uint *)((long)out[0x19] + 4) = uVar9;
  *(uint *)(out[0x19] + 1) = uVar11;
  *(uint *)((long)out[0x19] + 0xc) = uVar12;
  *(uint *)out[0x1a] = uVar6;
  *(uint *)((long)out[0x1a] + 4) = uVar9;
  *(uint *)(out[0x1a] + 1) = uVar11;
  *(uint *)((long)out[0x1a] + 0xc) = uVar12;
  *(uint *)out[0x1b] = uVar6;
  *(uint *)((long)out[0x1b] + 4) = uVar9;
  *(uint *)(out[0x1b] + 1) = uVar11;
  *(uint *)((long)out[0x1b] + 0xc) = uVar12;
  *(uint *)out[0x1c] = uVar6;
  *(uint *)((long)out[0x1c] + 4) = uVar9;
  *(uint *)(out[0x1c] + 1) = uVar11;
  *(uint *)((long)out[0x1c] + 0xc) = uVar12;
  *(uint *)out[0x1d] = uVar6;
  *(uint *)((long)out[0x1d] + 4) = uVar9;
  *(uint *)(out[0x1d] + 1) = uVar11;
  *(uint *)((long)out[0x1d] + 0xc) = uVar12;
  *(uint *)out[0x1e] = uVar6;
  *(uint *)((long)out[0x1e] + 4) = uVar9;
  *(uint *)(out[0x1e] + 1) = uVar11;
  *(uint *)((long)out[0x1e] + 0xc) = uVar12;
  *(uint *)out[0x1f] = uVar6;
  *(uint *)((long)out[0x1f] + 4) = uVar9;
  *(uint *)(out[0x1f] + 1) = uVar11;
  *(uint *)((long)out[0x1f] + 0xc) = uVar12;
  *(uint *)out[0x20] = uVar6;
  *(uint *)((long)out[0x20] + 4) = uVar9;
  *(uint *)(out[0x20] + 1) = uVar11;
  *(uint *)((long)out[0x20] + 0xc) = uVar12;
  *(uint *)out[0x21] = uVar6;
  *(uint *)((long)out[0x21] + 4) = uVar9;
  *(uint *)(out[0x21] + 1) = uVar11;
  *(uint *)((long)out[0x21] + 0xc) = uVar12;
  *(uint *)out[0x22] = uVar6;
  *(uint *)((long)out[0x22] + 4) = uVar9;
  *(uint *)(out[0x22] + 1) = uVar11;
  *(uint *)((long)out[0x22] + 0xc) = uVar12;
  *(uint *)out[0x23] = uVar6;
  *(uint *)((long)out[0x23] + 4) = uVar9;
  *(uint *)(out[0x23] + 1) = uVar11;
  *(uint *)((long)out[0x23] + 0xc) = uVar12;
  *(uint *)out[0x24] = uVar6;
  *(uint *)((long)out[0x24] + 4) = uVar9;
  *(uint *)(out[0x24] + 1) = uVar11;
  *(uint *)((long)out[0x24] + 0xc) = uVar12;
  *(uint *)out[0x25] = uVar6;
  *(uint *)((long)out[0x25] + 4) = uVar9;
  *(uint *)(out[0x25] + 1) = uVar11;
  *(uint *)((long)out[0x25] + 0xc) = uVar12;
  *(uint *)out[0x26] = uVar6;
  *(uint *)((long)out[0x26] + 4) = uVar9;
  *(uint *)(out[0x26] + 1) = uVar11;
  *(uint *)((long)out[0x26] + 0xc) = uVar12;
  *(uint *)out[0x27] = uVar6;
  *(uint *)((long)out[0x27] + 4) = uVar9;
  *(uint *)(out[0x27] + 1) = uVar11;
  *(uint *)((long)out[0x27] + 0xc) = uVar12;
  *(uint *)out[0x28] = uVar6;
  *(uint *)((long)out[0x28] + 4) = uVar9;
  *(uint *)(out[0x28] + 1) = uVar11;
  *(uint *)((long)out[0x28] + 0xc) = uVar12;
  *(uint *)out[0x29] = uVar6;
  *(uint *)((long)out[0x29] + 4) = uVar9;
  *(uint *)(out[0x29] + 1) = uVar11;
  *(uint *)((long)out[0x29] + 0xc) = uVar12;
  *(uint *)out[0x2a] = uVar6;
  *(uint *)((long)out[0x2a] + 4) = uVar9;
  *(uint *)(out[0x2a] + 1) = uVar11;
  *(uint *)((long)out[0x2a] + 0xc) = uVar12;
  *(uint *)out[0x2b] = uVar6;
  *(uint *)((long)out[0x2b] + 4) = uVar9;
  *(uint *)(out[0x2b] + 1) = uVar11;
  *(uint *)((long)out[0x2b] + 0xc) = uVar12;
  *(uint *)out[0x2c] = uVar6;
  *(uint *)((long)out[0x2c] + 4) = uVar9;
  *(uint *)(out[0x2c] + 1) = uVar11;
  *(uint *)((long)out[0x2c] + 0xc) = uVar12;
  *(uint *)out[0x2d] = uVar6;
  *(uint *)((long)out[0x2d] + 4) = uVar9;
  *(uint *)(out[0x2d] + 1) = uVar11;
  *(uint *)((long)out[0x2d] + 0xc) = uVar12;
  *(uint *)out[0x2e] = uVar6;
  *(uint *)((long)out[0x2e] + 4) = uVar9;
  *(uint *)(out[0x2e] + 1) = uVar11;
  *(uint *)((long)out[0x2e] + 0xc) = uVar12;
  *(uint *)out[0x2f] = uVar6;
  *(uint *)((long)out[0x2f] + 4) = uVar9;
  *(uint *)(out[0x2f] + 1) = uVar11;
  *(uint *)((long)out[0x2f] + 0xc) = uVar12;
  *(uint *)out[0x30] = uVar6;
  *(uint *)((long)out[0x30] + 4) = uVar9;
  *(uint *)(out[0x30] + 1) = uVar11;
  *(uint *)((long)out[0x30] + 0xc) = uVar12;
  *(uint *)out[0x31] = uVar6;
  *(uint *)((long)out[0x31] + 4) = uVar9;
  *(uint *)(out[0x31] + 1) = uVar11;
  *(uint *)((long)out[0x31] + 0xc) = uVar12;
  *(uint *)out[0x32] = uVar6;
  *(uint *)((long)out[0x32] + 4) = uVar9;
  *(uint *)(out[0x32] + 1) = uVar11;
  *(uint *)((long)out[0x32] + 0xc) = uVar12;
  *(uint *)out[0x33] = uVar6;
  *(uint *)((long)out[0x33] + 4) = uVar9;
  *(uint *)(out[0x33] + 1) = uVar11;
  *(uint *)((long)out[0x33] + 0xc) = uVar12;
  *(uint *)out[0x34] = uVar6;
  *(uint *)((long)out[0x34] + 4) = uVar9;
  *(uint *)(out[0x34] + 1) = uVar11;
  *(uint *)((long)out[0x34] + 0xc) = uVar12;
  *(uint *)out[0x35] = uVar6;
  *(uint *)((long)out[0x35] + 4) = uVar9;
  *(uint *)(out[0x35] + 1) = uVar11;
  *(uint *)((long)out[0x35] + 0xc) = uVar12;
  *(uint *)out[0x36] = uVar6;
  *(uint *)((long)out[0x36] + 4) = uVar9;
  *(uint *)(out[0x36] + 1) = uVar11;
  *(uint *)((long)out[0x36] + 0xc) = uVar12;
  *(uint *)out[0x37] = uVar6;
  *(uint *)((long)out[0x37] + 4) = uVar9;
  *(uint *)(out[0x37] + 1) = uVar11;
  *(uint *)((long)out[0x37] + 0xc) = uVar12;
  *(uint *)out[0x38] = uVar6;
  *(uint *)((long)out[0x38] + 4) = uVar9;
  *(uint *)(out[0x38] + 1) = uVar11;
  *(uint *)((long)out[0x38] + 0xc) = uVar12;
  *(uint *)out[0x39] = uVar6;
  *(uint *)((long)out[0x39] + 4) = uVar9;
  *(uint *)(out[0x39] + 1) = uVar11;
  *(uint *)((long)out[0x39] + 0xc) = uVar12;
  *(uint *)out[0x3a] = uVar6;
  *(uint *)((long)out[0x3a] + 4) = uVar9;
  *(uint *)(out[0x3a] + 1) = uVar11;
  *(uint *)((long)out[0x3a] + 0xc) = uVar12;
  *(uint *)out[0x3b] = uVar6;
  *(uint *)((long)out[0x3b] + 4) = uVar9;
  *(uint *)(out[0x3b] + 1) = uVar11;
  *(uint *)((long)out[0x3b] + 0xc) = uVar12;
  *(uint *)out[0x3c] = uVar6;
  *(uint *)((long)out[0x3c] + 4) = uVar9;
  *(uint *)(out[0x3c] + 1) = uVar11;
  *(uint *)((long)out[0x3c] + 0xc) = uVar12;
  *(uint *)out[0x3d] = uVar6;
  *(uint *)((long)out[0x3d] + 4) = uVar9;
  *(uint *)(out[0x3d] + 1) = uVar11;
  *(uint *)((long)out[0x3d] + 0xc) = uVar12;
  *(uint *)out[0x3e] = uVar6;
  *(uint *)((long)out[0x3e] + 4) = uVar9;
  *(uint *)(out[0x3e] + 1) = uVar11;
  *(uint *)((long)out[0x3e] + 0xc) = uVar12;
  *(uint *)out[0x3f] = uVar6;
  *(uint *)((long)out[0x3f] + 4) = uVar9;
  *(uint *)(out[0x3f] + 1) = uVar11;
  *(uint *)((long)out[0x3f] + 0xc) = uVar12;
  return;
}

Assistant:

static void idct64x64_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);

  {
    __m128i x;

    // stage 1
    // stage 2
    // stage 3
    // stage 4
    // stage 5
    // stage 6
    x = half_btf_0_sse4_1(&cospi32, &in[0], &rnding, bit);

    // stage 8
    // stage 9
    // stage 10
    // stage 11
    if (!do_cols) {
      const int log_range_out = AOMMAX(16, bd + 6);
      clamp_lo = _mm_set1_epi32(-(1 << (log_range_out - 1)));
      clamp_hi = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
      if (out_shift != 0) {
        __m128i offset = _mm_set1_epi32((1 << out_shift) >> 1);
        x = _mm_add_epi32(x, offset);
        x = _mm_sra_epi32(x, _mm_cvtsi32_si128(out_shift));
      }
    }
    x = _mm_max_epi32(x, clamp_lo);
    x = _mm_min_epi32(x, clamp_hi);
    out[0] = x;
    out[1] = x;
    out[2] = x;
    out[3] = x;
    out[4] = x;
    out[5] = x;
    out[6] = x;
    out[7] = x;
    out[8] = x;
    out[9] = x;
    out[10] = x;
    out[11] = x;
    out[12] = x;
    out[13] = x;
    out[14] = x;
    out[15] = x;
    out[16] = x;
    out[17] = x;
    out[18] = x;
    out[19] = x;
    out[20] = x;
    out[21] = x;
    out[22] = x;
    out[23] = x;
    out[24] = x;
    out[25] = x;
    out[26] = x;
    out[27] = x;
    out[28] = x;
    out[29] = x;
    out[30] = x;
    out[31] = x;
    out[32] = x;
    out[33] = x;
    out[34] = x;
    out[35] = x;
    out[36] = x;
    out[37] = x;
    out[38] = x;
    out[39] = x;
    out[40] = x;
    out[41] = x;
    out[42] = x;
    out[43] = x;
    out[44] = x;
    out[45] = x;
    out[46] = x;
    out[47] = x;
    out[48] = x;
    out[49] = x;
    out[50] = x;
    out[51] = x;
    out[52] = x;
    out[53] = x;
    out[54] = x;
    out[55] = x;
    out[56] = x;
    out[57] = x;
    out[58] = x;
    out[59] = x;
    out[60] = x;
    out[61] = x;
    out[62] = x;
    out[63] = x;
  }
}